

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase31::run(TestCase31 *this)

{
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  Reader reader_00;
  bool bVar1;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  Builder root;
  Builder local_1d8;
  Builder local_1b0;
  Reader local_188;
  Reader local_158;
  Reader local_128;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&local_1b0,&root);
  builder_00._builder.capTable = local_1b0._builder.capTable;
  builder_00._builder.segment = local_1b0._builder.segment;
  builder_00._builder.data = local_1b0._builder.data;
  builder_00._builder.pointers = local_1b0._builder.pointers;
  builder_00._builder.dataSize = local_1b0._builder.dataSize;
  builder_00._builder.pointerCount = local_1b0._builder.pointerCount;
  builder_00._builder._38_2_ = local_1b0._builder._38_2_;
  initTestMessage(builder_00);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x24,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
               (char (*) [39])"failed: expected root.hasStructField()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructField(&orphan,&root);
  if ((orphan.builder.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x27,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
               (char (*) [38])"failed: expected !(orphan == nullptr)");
  }
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::applyReader
            (&local_158,&orphan.builder);
  reader._reader.capTable = local_158._reader.capTable;
  reader._reader.segment = local_158._reader.segment;
  reader._reader.data = local_158._reader.data;
  reader._reader.pointers = local_158._reader.pointers;
  reader._reader.dataSize = local_158._reader.dataSize;
  reader._reader.pointerCount = local_158._reader.pointerCount;
  reader._reader._38_2_ = local_158._reader._38_2_;
  reader._reader.nestingLimit = local_158._reader.nestingLimit;
  reader._reader._44_4_ = local_158._reader._44_4_;
  checkTestMessage(reader);
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&local_1d8,&orphan.builder);
  builder_01._builder.capTable = local_1d8._builder.capTable;
  builder_01._builder.segment = local_1d8._builder.segment;
  builder_01._builder.data = local_1d8._builder.data;
  builder_01._builder.pointers = local_1d8._builder.pointers;
  builder_01._builder.dataSize = local_1d8._builder.dataSize;
  builder_01._builder.pointerCount = local_1d8._builder.pointerCount;
  builder_01._builder._38_2_ = local_1d8._builder._38_2_;
  checkTestMessage(builder_01);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
               (char (*) [42])"failed: expected !(root.hasStructField())");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField(&root,&orphan);
  if ((orphan.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2f,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
               (char (*) [39])"failed: expected root.hasStructField()");
  }
  StructBuilder::asReader(&root._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField(&local_188,&local_128);
  reader_00._reader.capTable = local_188._reader.capTable;
  reader_00._reader.segment = local_188._reader.segment;
  reader_00._reader.data = local_188._reader.data;
  reader_00._reader.pointers = local_188._reader.pointers;
  reader_00._reader.dataSize = local_188._reader.dataSize;
  reader_00._reader.pointerCount = local_188._reader.pointerCount;
  reader_00._reader._38_2_ = local_188._reader._38_2_;
  reader_00._reader.nestingLimit = local_188._reader.nestingLimit;
  reader_00._reader._44_4_ = local_188._reader._44_4_;
  checkTestMessage(reader_00);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Any, AnyPointer) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initTestMessage(root.getAnyPointerField().initAs<TestAllTypes>());
  checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  root.getAnyPointerField().setAs<Text>("foo");
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());
  EXPECT_EQ("foo", root.asReader().getAnyPointerField().getAs<Text>());

  root.getAnyPointerField().setAs<Data>(data("foo"));
  EXPECT_EQ(data("foo"), root.getAnyPointerField().getAs<Data>());
  EXPECT_EQ(data("foo"), root.asReader().getAnyPointerField().getAs<Data>());

  {
    root.getAnyPointerField().setAs<List<uint32_t>>({123, 456, 789});

    {
      List<uint32_t>::Builder list = root.getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }

    {
      List<uint32_t>::Reader list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }
  }

  {
    root.getAnyPointerField().setAs<List<Text>>({"foo", "bar"});

    {
      List<Text>::Builder list = root.getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }

    {
      List<Text>::Reader list = root.asReader().getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }
  }

  {
    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().initAs<List<TestAllTypes>>(2);
      ASSERT_EQ(2u, list.size());
      initTestMessage(list[0]);
    }

    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }

    {
      List<TestAllTypes>::Reader list =
          root.asReader().getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }
  }
}